

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

int getFBConfigAttrib(GLXFBConfig fbconfig,int attrib)

{
  int local_18;
  int local_14;
  int value;
  int attrib_local;
  GLXFBConfig fbconfig_local;
  
  local_14 = attrib;
  _value = fbconfig;
  if (_glfw.glx.SGIX_fbconfig == '\0') {
    glXGetFBConfigAttrib(_glfw.x11.display,fbconfig,attrib,&local_18);
  }
  else {
    (*_glfw.glx.GetFBConfigAttribSGIX)(_glfw.x11.display,fbconfig,attrib,&local_18);
  }
  return local_18;
}

Assistant:

static int getFBConfigAttrib(GLXFBConfig fbconfig, int attrib)
{
    int value;

    if (_glfw.glx.SGIX_fbconfig)
    {
        _glfw.glx.GetFBConfigAttribSGIX(_glfw.x11.display,
                                        fbconfig, attrib, &value);
    }
    else
        glXGetFBConfigAttrib(_glfw.x11.display, fbconfig, attrib, &value);

    return value;
}